

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall features::Sift::process(Sift *this)

{
  pointer pOVar1;
  byte bVar2;
  ostream *poVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  util::ClockTimer::now();
  util::ClockTimer::now();
  if ((this->options).verbose_output == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Creating ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(this->options).max_octave - (this->options).min_octave);
    poVar3 = std::operator<<(poVar3," octaves (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->options).min_octave);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->options).max_octave);
    poVar3 = std::operator<<(poVar3,")...");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  util::ClockTimer::now();
  create_octaves(this);
  bVar2 = (this->options).debug_output;
  if ((bool)bVar2 == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Creating octaves took ");
    util::ClockTimer::now();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"ms.");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar2 = (this->options).debug_output;
  }
  if ((bVar2 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Detecting local extrema...");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  util::ClockTimer::now();
  extrema_detection(this);
  bVar2 = (this->options).debug_output;
  if ((bool)bVar2 == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Detected ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," keypoints, took ");
    util::ClockTimer::now();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"ms.");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar2 = (this->options).debug_output;
  }
  if ((bVar2 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Localizing and filtering keypoints...");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  util::ClockTimer::now();
  keypoint_localization(this);
  if ((this->options).debug_output == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Retained ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," stable ");
    poVar3 = std::operator<<(poVar3,"keypoints, took ");
    util::ClockTimer::now();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"ms.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  lVar4 = 0x18;
  for (uVar5 = 0;
      pOVar1 = (this->octaves).
               super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->octaves).
                             super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1) / 0x60);
      uVar5 = uVar5 + 1) {
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::clear((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
             *)((long)&(pOVar1->img).
                       super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                       ._M_impl + lVar4));
    lVar4 = lVar4 + 0x60;
  }
  if ((this->options).verbose_output != false) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Generating keypoint descriptors...");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  util::ClockTimer::now();
  descriptor_generation(this);
  if ((this->options).debug_output == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Generated ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," descriptors, took ");
    util::ClockTimer::now();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"ms.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if ((this->options).verbose_output == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SIFT: Generated ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," descriptors from ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," keypoints,");
    poVar3 = std::operator<<(poVar3," took ");
    util::ClockTimer::now();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"ms.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::clear
            (&this->octaves);
  return;
}

Assistant:

void
Sift::process (void)
{
    util::ClockTimer timer, total_timer;

    /*
     * Creates the scale space representation of the image by
     * sampling the scale space and computing the DoG images.
     * See Section 3, 3.2 and 3.3 in SIFT article.
     */
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Creating "
            << (this->options.max_octave - this->options.min_octave)
            << " octaves (" << this->options.min_octave << " to "
            << this->options.max_octave << ")..." << std::endl;
    }
    timer.reset();
    this->create_octaves();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Creating octaves took "
            << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Detects local extrema in the DoG function as described in Section 3.1.
     */
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Detecting local extrema..." << std::endl;
    }
    timer.reset();
    this->extrema_detection();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Detected " << this->keypoints.size()
            << " keypoints, took " << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Accurate keypoint localization and filtering.
     * According to Section 4 in SIFT article.
     */
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Localizing and filtering keypoints..." << std::endl;
    }
    timer.reset();
    this->keypoint_localization();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Retained " << this->keypoints.size() << " stable "
            << "keypoints, took " << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Difference of Gaussian images are not needed anymore.
     */
    for (std::size_t i = 0; i < this->octaves.size(); ++i)
        this->octaves[i].dog.clear();

    /*
     * Generate the list of keypoint descriptors.
     * See Section 5 and 6 in the SIFT article.
     * This list can in general be larger than the amount of keypoints,
     * since for each keypoint several descriptors may be created.
     */
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Generating keypoint descriptors..." << std::endl;
    }
    timer.reset();
    this->descriptor_generation();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Generated " << this->descriptors.size()
            << " descriptors, took " << timer.get_elapsed() << "ms."
            << std::endl;
    }
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Generated " << this->descriptors.size()
            << " descriptors from " << this->keypoints.size() << " keypoints,"
            << " took " << total_timer.get_elapsed() << "ms." << std::endl;
    }

    /* Free memory. */
    this->octaves.clear();
}